

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O0

TreeNodePtr __thiscall
OpenMD::NameFinder::createNode(NameFinder *this,TreeNodePtr *parent,string *name)

{
  bool bVar1;
  iterator this_00;
  element_type *peVar2;
  string *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  element_type *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_shared_ptr<TreeNode>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  TreeNodePtr TVar5;
  iterator foundIter;
  TreeNodePtr *node;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>_>
  *in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>
  *in_stack_fffffffffffffef8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>_>
  *this_01;
  SelectionSet *nbits;
  SelectionSet *this_02;
  SelectionSet local_60;
  _Base_ptr local_38;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>
  local_30;
  undefined1 local_21;
  string *local_20;
  
  local_21 = 0;
  local_20 = in_RCX;
  std::shared_ptr<OpenMD::TreeNode>::shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3ba3f3);
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>
  ::_Rb_tree_iterator(&local_30);
  std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3ba40a);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>_>
            ::find(in_stack_fffffffffffffee8,(key_type *)0x3ba41e);
  local_38 = this_00._M_node;
  local_30._M_node = this_00._M_node;
  std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3ba44c);
  local_60.bitsets_.super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>_>
                ::end(in_stack_fffffffffffffee8);
  bVar1 = std::operator==(&local_30,
                          (_Self *)&local_60.bitsets_.
                                    super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    std::make_shared<OpenMD::TreeNode>();
    this_02 = &local_60;
    std::shared_ptr<OpenMD::TreeNode>::operator=
              ((shared_ptr<OpenMD::TreeNode> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
    std::shared_ptr<OpenMD::TreeNode>::~shared_ptr((shared_ptr<OpenMD::TreeNode> *)0x3ba4ae);
    peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3ba4c5);
    std::__cxx11::string::operator=((string *)peVar2,local_20);
    peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3ba4de);
    nbits = &peVar2->bs;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_00._M_node,in_RDX);
    SelectionSet::resize(this_02,(vector<int,_std::allocator<int>_> *)nbits);
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff00);
    peVar2 = std::__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3ba52a);
    this_01 = &peVar2->children;
    std::make_pair<std::__cxx11::string_const&,std::shared_ptr<OpenMD::TreeNode>&>
              (&in_stack_fffffffffffffef8->first,
               (shared_ptr<OpenMD::TreeNode> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
    _Var4 = std::
            map<std::__cxx11::string,std::shared_ptr<OpenMD::TreeNode>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::TreeNode>>>>
            ::insert<std::pair<std::__cxx11::string,std::shared_ptr<OpenMD::TreeNode>>>
                      (this_01,in_stack_fffffffffffffef8);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>
             *)CONCAT17(_Var4.second,in_stack_fffffffffffffef0));
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::TreeNode>_>_>
                  *)0x3ba5ed);
    std::shared_ptr<OpenMD::TreeNode>::operator=
              ((shared_ptr<OpenMD::TreeNode> *)
               CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
               (shared_ptr<OpenMD::TreeNode> *)in_stack_fffffffffffffee8);
    _Var3._M_pi = extraout_RDX_00;
  }
  TVar5.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  TVar5.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (TreeNodePtr)TVar5.super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TreeNodePtr NameFinder::createNode(TreeNodePtr parent,
                                     const std::string& name) {
    TreeNodePtr node;
    std::map<std::string, TreeNodePtr>::iterator foundIter;
    foundIter = parent->children.find(name);
    if (foundIter == parent->children.end()) {
      node       = std::make_shared<TreeNode>();
      node->name = name;
      node->bs.resize(nObjects_);
      parent->children.insert(std::make_pair(name, node));
    } else {
      node = foundIter->second;
    }
    return node;
  }